

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  undefined4 uVar1;
  int iVar2;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImGuiPopupData *pIVar3;
  ImGuiContext *pIVar4;
  char *text;
  bool bVar5;
  bool bVar6;
  ImU32 col;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint flags;
  bool bVar7;
  undefined7 in_register_00000011;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ImGuiWindow *this_00;
  uint uVar11;
  float fVar12;
  ImVec2 IVar13;
  ImVec2 IVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect IVar18;
  ImGuiID id;
  float local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  ImVec2 ta;
  ImVec2 local_98;
  float local_90;
  undefined4 local_8c;
  undefined1 local_88 [16];
  ImGuiWindow *local_78;
  char *local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_d0 = (undefined4)CONCAT71(in_register_00000011,enabled);
  local_70 = icon;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  bVar5 = IsPopupOpen(id,0);
  flags = (this->Flags & 0x10000000U) >> 4 | 0x10080145;
  bVar6 = ImVector<unsigned_int>::contains(&pIVar4->MenusIdSubmittedThisFrame,&id);
  if (bVar6) {
    if (bVar5) {
      bVar5 = BeginPopupEx(id,flags);
      return bVar5;
    }
    goto LAB_0014545b;
  }
  ImVector<unsigned_int>::push_back(&pIVar4->MenusIdSubmittedThisFrame,&id);
  local_b0 = label;
  IVar13 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88._8_8_ = extraout_XMM0_Qb;
  local_88._0_4_ = IVar13.x;
  local_88._4_4_ = IVar13.y;
  bVar6 = IsRootOfOpenMenuSet();
  local_78 = pIVar4->NavWindow;
  local_8c = (undefined4)CONCAT71(extraout_var_00,bVar6);
  if (bVar6) {
    pIVar4->NavWindow = this;
  }
  fVar12 = (this->DC).CursorPos.x;
  local_c8 = ZEXT416((uint)(this->DC).CursorPos.y);
  PushID(local_b0);
  if ((char)local_d0 == '\0') {
    BeginDisabled(true);
  }
  text = local_70;
  local_cc = (undefined4)CONCAT71(extraout_var,bVar5);
  if ((this->DC).LayoutType == 0) {
    fVar15 = 0.0;
    local_d4 = (fVar12 + -1.0) - (float)(int)((pIVar4->Style).ItemSpacing.x * 0.5);
    local_c8._0_4_ = (float)local_c8._0_4_ - (pIVar4->Style).FramePadding.y;
    local_98.y = ImGuiWindow::MenuBarHeight(this);
    local_98.y = local_98.y + (float)local_c8._0_4_;
    local_98.x = local_d4;
    fVar12 = (pIVar4->Style).ItemSpacing.x;
    (this->DC).CursorPos.x = (float)(int)(fVar12 * 0.5) + (this->DC).CursorPos.x;
    ta.y = (pIVar4->Style).ItemSpacing.y;
    ta.x = fVar12 + fVar12;
    PushStyleVar(0xe,&ta);
    IVar13 = (this->DC).CursorPos;
    local_c8._4_4_ = (this->DC).CurrLineTextBaseOffset + IVar13.y;
    local_c8._0_4_ = (float)(this->DC).MenuColumns.OffsetLabel + IVar13.x;
    local_c8._8_4_ = fVar15 + 0.0;
    local_c8._12_4_ = 0;
    ta.y = 0.0;
    ta.x = (float)local_88._0_4_;
    bVar5 = Selectable("",bVar5,0x500001,&ta);
    RenderText((ImVec2)local_c8._0_8_,local_b0,(char *)0x0,true);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar4->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
    uVar1 = local_cc;
  }
  else {
    local_98.y = (float)local_c8._0_4_ - (pIVar4->Style).WindowPadding.y;
    local_58 = ZEXT416(0);
    local_d4 = fVar12;
    local_98.x = fVar12;
    if ((local_70 != (char *)0x0) && (*local_70 != '\0')) {
      local_58._0_8_ = CalcTextSize(local_70,(char *)0x0,false,-1.0);
      local_58._8_8_ = extraout_XMM0_Qb_00;
    }
    local_90 = ImGuiMenuColumns::DeclColumns
                         (&(this->DC).MenuColumns,local_58._0_4_,(float)local_88._0_4_,0.0,
                          (float)(int)(pIVar4->FontSize * 1.2));
    IVar13 = GetContentRegionAvail();
    fVar12 = IVar13.x - local_90;
    local_88 = ZEXT416(~-(uint)(fVar12 <= 0.0) & (uint)fVar12);
    IVar13 = (this->DC).CursorPos;
    local_68.y = (this->DC).CurrLineTextBaseOffset + IVar13.y;
    local_68.x = (float)(this->DC).MenuColumns.OffsetLabel + IVar13.x;
    uStack_60 = 0;
    ta.y = 0.0;
    ta.x = local_90;
    bVar5 = Selectable("",bVar5,0x1500001,&ta);
    RenderText(local_68,local_b0,(char *)0x0,true);
    if ((float)local_58._0_4_ <= 0.0) {
      local_c8._0_4_ = (float)local_c8._0_4_ + 0.0;
      uStack_b4 = local_c8._4_4_;
    }
    else {
      IVar13.x = (float)(this->DC).MenuColumns.OffsetIcon + local_d4;
      local_c8._0_4_ = (float)local_c8._0_4_ + 0.0;
      IVar13.y = (float)local_c8._0_4_;
      RenderText(IVar13,text,(char *)0x0,true);
      uStack_b4 = local_c8._4_4_;
    }
    uVar1 = local_cc;
    draw_list = this->DrawList;
    local_c8._4_4_ = local_c8._0_4_;
    local_c8._0_4_ =
         pIVar4->FontSize * 0.3 + (float)local_88._0_4_ + (float)(this->DC).MenuColumns.OffsetMark +
         local_d4;
    uStack_b8 = 0;
    col = GetColorU32(0,1.0);
    RenderArrow(draw_list,(ImVec2)local_c8._0_8_,col,1,1.0);
  }
  bVar8 = (byte)uVar1;
  if ((char)local_d0 == '\0') {
    EndDisabled();
  }
  if ((char)local_d0 == '\x01' && pIVar4->HoveredId == id) {
    bVar9 = pIVar4->NavDisableMouseHover ^ 1;
  }
  else {
    bVar9 = 0;
  }
  bVar10 = (byte)local_8c;
  if (bVar10 != 0) {
    pIVar4->NavWindow = local_78;
  }
  if ((this->DC).LayoutType == 1) {
    iVar2 = (pIVar4->BeginPopupStack).Size;
    if ((iVar2 < (pIVar4->OpenPopupStack).Size) &&
       (pIVar3 = (pIVar4->OpenPopupStack).Data, pIVar3[iVar2].SourceWindow == this)) {
      this_00 = pIVar3[iVar2].Window;
    }
    else {
      this_00 = (ImGuiWindow *)0x0;
    }
    bVar6 = true;
    if (((pIVar4->HoveredWindow == this) && (this_00 != (ImGuiWindow *)0x0)) &&
       ((this->Flags & 0x400) == 0)) {
      local_c8._0_4_ = pIVar4->FontSize;
      IVar18 = ImGuiWindow::Rect(this_00);
      local_40.x = IVar18.Max.x;
      IVar13 = (pIVar4->IO).MousePos;
      IVar14 = (pIVar4->IO).MouseDelta;
      fVar15 = IVar13.x - IVar14.x;
      ta.y = IVar13.y - IVar14.y;
      fVar12 = (this_00->Pos).x;
      IVar14.y = IVar18.Min.y;
      if (fVar12 < (this->Pos).x || fVar12 == (this->Pos).x) {
        IVar14.x = local_40.x;
        fVar12 = 0.5;
      }
      else {
        fVar12 = -0.5;
        local_40.x = IVar18.Min.x;
        IVar14 = IVar18.Min;
      }
      fVar16 = ABS(fVar15 - IVar14.x) * 0.3;
      fVar17 = (float)local_c8._0_4_ * 2.5;
      if (fVar16 <= (float)local_c8._0_4_ * 2.5) {
        fVar17 = fVar16;
      }
      uVar11 = -(uint)(fVar16 < (float)local_c8._0_4_ * 0.5);
      fVar17 = (float)(uVar11 & (uint)((float)local_c8._0_4_ * 0.5) | ~uVar11 & (uint)fVar17);
      ta.x = fVar12 + fVar15;
      fVar12 = (IVar14.y - fVar17) - ta.y;
      uVar11 = -(uint)((float)local_c8._0_4_ * -8.0 <= fVar12);
      local_38.y = (float)(~uVar11 & (uint)((float)local_c8._0_4_ * -8.0) | (uint)fVar12 & uVar11) +
                   ta.y;
      local_38.x = IVar14.x;
      fVar12 = (IVar18.Max.y + fVar17) - ta.y;
      if ((float)local_c8._0_4_ * 8.0 <= fVar12) {
        fVar12 = (float)local_c8._0_4_ * 8.0;
      }
      local_40.y = fVar12 + ta.y;
      bVar6 = ImTriangleContainsPoint(&ta,&local_38,&local_40,&(pIVar4->IO).MousePos);
      bVar6 = !bVar6;
    }
    if ((((bVar8 ^ 1 | bVar9) & 1) == 0) && (pIVar4->HoveredWindow == this)) {
      bVar10 = (pIVar4->HoveredIdPreviousFrame != id && pIVar4->HoveredIdPreviousFrame != 0) & bVar6
      ;
    }
    else {
      bVar10 = 0;
    }
    bVar7 = (bool)((bVar8 ^ 1) & bVar5);
    if ((bVar9 & 1) == 0) {
      bVar6 = bVar7;
    }
    if (bVar5 != false) {
      bVar6 = bVar7;
    }
    if (bVar8 != 0) {
      bVar6 = bVar7;
    }
    if ((pIVar4->NavId == id) && (pIVar4->NavMoveDir == 1)) {
LAB_0014539b:
      NavMoveRequestCancel();
      bVar6 = true;
    }
  }
  else if (bVar5 == false) {
    if ((byte)(bVar8 | bVar10 & bVar9 ^ 1) == 1) {
      if (pIVar4->NavId == id) {
        bVar10 = 0;
        if (pIVar4->NavMoveDir == 3) goto LAB_0014539b;
        bVar6 = false;
      }
      else {
        bVar6 = false;
        bVar10 = 0;
      }
    }
    else {
      bVar6 = true;
      bVar10 = 0;
      bVar8 = 0;
    }
  }
  else {
    bVar10 = bVar10 & bVar5 & bVar8;
    bVar6 = (bool)(bVar10 ^ 1);
    bVar8 = bVar8 ^ bVar10;
  }
  if ((((char)local_d0 == '\0') || (bVar10 != 0)) && (bVar5 = IsPopupOpen(id,0), bVar5)) {
    ClosePopupToLevel((pIVar4->BeginPopupStack).Size,true);
  }
  PopID();
  if ((((~bVar6 | bVar8) & 1) == 0) &&
     ((pIVar4->BeginPopupStack).Size < (pIVar4->OpenPopupStack).Size)) {
    OpenPopup(local_b0,0);
    return false;
  }
  if (bVar6 == false) {
    if (bVar8 == 0) {
LAB_0014545b:
      (pIVar4->NextWindowData).Flags = 0;
      return false;
    }
  }
  else {
    OpenPopup(local_b0,0);
  }
  ta.x = 0.0;
  ta.y = 0.0;
  SetNextWindowPos(&local_98,1,&ta);
  PushStyleVar(7,(pIVar4->Style).PopupRounding);
  bVar5 = BeginPopupEx(id,flags);
  PopStyleVar(1);
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}